

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O0

TestCase * __thiscall
iutest::UnitTestImpl::AddTestCase<iutest::TypedTestCase<char32_t>>
          (UnitTestImpl *this,char *testcase_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  TypedTestCase<char32_t> *local_38;
  TestCase *p;
  TearDownMethod teardown_local;
  SetUpMethod setup_local;
  TestTypeId id_local;
  char *testcase_name_local;
  UnitTestImpl *this_local;
  
  local_38 = (TypedTestCase<char32_t> *)FindTestCase(this,testcase_name,id);
  if (local_38 == (TypedTestCase<char32_t> *)0x0) {
    local_38 = (TypedTestCase<char32_t> *)operator_new(0xd0);
    TypedTestCase<char32_t>::TypedTestCase(local_38,testcase_name,id,setup,teardown);
    detail::iu_list<iutest::TestCase>::push_back(&this->m_testcases,(node_ptr)local_38);
  }
  return &local_38->super_TestCase;
}

Assistant:

TestCase* AddTestCase(const char* testcase_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestCase* p = FindTestCase(testcase_name, id);
        if( p == NULL )
        {
            p = new T (testcase_name, id, setup, teardown);
            m_testcases.push_back(p);
        }
        return p;
    }